

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char * openjtalk_getFullVoicePathSjis(OpenJTalk *oj,char *path,char *buffer)

{
  char *pcVar1;
  char *pcVar2;
  char temp [260];
  char acStack_128 [272];
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    return (char *)0x0;
  }
  if (path != (char *)0x0) {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if (*path == '\0') {
      oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
      return (char *)0x0;
    }
    if (buffer != (char *)0x0) {
      pcVar1 = convert_charset_path(path,CS_SHIFT_JIS,acStack_128,CS_UTF_8);
      if (pcVar1 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar1 = make_voice_path(oj,acStack_128);
      if (pcVar1 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar2 = convert_charset_path(pcVar1,CS_UTF_8,buffer,CS_SHIFT_JIS);
      free(pcVar1);
      return pcVar2;
    }
  }
  oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
  return (char *)0x0;
}

Assistant:

OPENJTALK_DLL_API char *OPENJTALK_CONVENTION openjtalk_getFullVoicePathSjis(OpenJTalk *oj, const char *path, char *buffer)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	if (!path)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return NULL;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!path || strlen(path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return NULL;
	}

	if (!buffer)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return NULL;
	}

	char temp[MAX_PATH];
#if defined(_WIN32)
	char *res = sjistou8_path(path, temp);
#else
	char *res = sjistou8_path(path, temp);
#endif

	if (!res)
	{
		return NULL;
	}

	char *temp2 = make_voice_path(oj, temp);
	if (!temp2)
	{
		return NULL;
	}

#if defined(_WIN32)
	char *res2 = u8tosjis_path(temp2, buffer);
#else
	char *res2 = u8tosjis_path(temp2, buffer);
#endif
	free(temp2);
	return res2;
}